

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

wchar_t * PostEffectTypeString(Types type)

{
  wchar_t *pwStack_10;
  Types type_local;
  
  if (type == Early) {
    pwStack_10 = L"early";
  }
  else if (type == ToneMapping) {
    pwStack_10 = L"tone-mapping";
  }
  else if (type == Late) {
    pwStack_10 = L"late";
  }
  else {
    ON_REMOVE_ASAP_AssertEx
              (0,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_post_effects.cpp"
               ,0x7a,"","false is false");
    pwStack_10 = L"";
  }
  return pwStack_10;
}

Assistant:

static const wchar_t* PostEffectTypeString(ON_PostEffect::Types type)
{
  switch (type)
  {
    case ON_PostEffect::Types::Early:       return ON_RDK_PEP_TYPE_EARLY;
    case ON_PostEffect::Types::ToneMapping: return ON_RDK_PEP_TYPE_TONE_MAPPING;
    case ON_PostEffect::Types::Late:        return ON_RDK_PEP_TYPE_LATE;
    default: ON_ASSERT(false); return L"";
  }
}